

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

void equation_system_add(aom_equation_system_t *dest,aom_equation_system_t *src)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = dest->n;
  lVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (uVar4 = 0; lVar5 = lVar2, uVar6 = (ulong)uVar1, uVar4 != uVar3; uVar4 = uVar4 + 1) {
    while (uVar6 != 0) {
      *(double *)((long)dest->A + lVar5) =
           *(double *)((long)src->A + lVar5) + *(double *)((long)dest->A + lVar5);
      lVar5 = lVar5 + 8;
      uVar6 = uVar6 - 1;
    }
    dest->b[uVar4] = src->b[uVar4] + dest->b[uVar4];
    lVar2 = lVar2 + (long)(int)uVar1 * 8;
  }
  return;
}

Assistant:

static void equation_system_add(aom_equation_system_t *dest,
                                aom_equation_system_t *src) {
  const int n = dest->n;
  int i, j;
  for (i = 0; i < n; ++i) {
    for (j = 0; j < n; ++j) {
      dest->A[i * n + j] += src->A[i * n + j];
    }
    dest->b[i] += src->b[i];
  }
}